

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

void __thiscall QTextBrowser::keyPressEvent(QTextBrowser *this,QKeyEvent *ev)

{
  long lVar1;
  undefined4 uVar2;
  QFlagsStorage<Qt::KeyboardModifier> QVar3;
  Int IVar4;
  uint uVar5;
  socklen_t *__addr_len;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  int __fd;
  QKeyEvent *in_RSI;
  QKeyEvent *in_RDI;
  long in_FS_OFFSET;
  KeyboardModifier in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QKeyEvent *e;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  e = in_RDI;
  uVar2 = QKeyEvent::modifiers();
  __fd = 0x8000000;
  QVar3.i = (Int)QFlags<Qt::KeyboardModifier>::operator&
                           ((QFlags<Qt::KeyboardModifier> *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffff4);
  if (IVar4 != 0) {
    uVar5 = QKeyEvent::key(in_RSI);
    __addr_len = (socklen_t *)(ulong)uVar5;
    if (uVar5 == 0x1000012) {
      (**(code **)(*(long *)in_RDI + 0x1f0))();
      QEvent::accept((QEvent *)in_RSI,__fd,__addr_00,__addr_len);
      goto LAB_006df0a0;
    }
    if (uVar5 == 0x1000013) {
      (**(code **)(*(long *)in_RDI + 0x200))();
      QEvent::accept((QEvent *)in_RSI,__fd,__addr_01,__addr_len);
      goto LAB_006df0a0;
    }
    if (uVar5 == 0x1000014) {
      (**(code **)(*(long *)in_RDI + 0x1f8))();
      QEvent::accept((QEvent *)in_RSI,__fd,__addr,__addr_len);
      goto LAB_006df0a0;
    }
  }
  QTextEdit::keyPressEvent((QTextEdit *)CONCAT44(QVar3.i,uVar2),e);
LAB_006df0a0:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextBrowser::keyPressEvent(QKeyEvent *ev)
{
#ifdef QT_KEYPAD_NAVIGATION
    Q_D(QTextBrowser);
    switch (ev->key()) {
    case Qt::Key_Select:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            if (!hasEditFocus()) {
                setEditFocus(true);
                return;
            } else {
                QTextCursor cursor = d->control->textCursor();
                QTextCharFormat charFmt = cursor.charFormat();
                if (!cursor.hasSelection() || charFmt.anchorHref().isEmpty()) {
                    ev->accept();
                    return;
                }
            }
        }
        break;
    case Qt::Key_Back:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            if (hasEditFocus()) {
                setEditFocus(false);
                ev->accept();
                return;
            }
        }
        QTextEdit::keyPressEvent(ev);
        return;
    default:
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            ev->ignore();
            return;
        }
    }
#endif

    if (ev->modifiers() & Qt::AltModifier) {
        switch (ev->key()) {
        case Qt::Key_Right:
            forward();
            ev->accept();
            return;
        case Qt::Key_Left:
            backward();
            ev->accept();
            return;
        case Qt::Key_Up:
            home();
            ev->accept();
            return;
        }
    }
#ifdef QT_KEYPAD_NAVIGATION
    else {
        if (ev->key() == Qt::Key_Up) {
            d->keypadMove(false);
            return;
        } else if (ev->key() == Qt::Key_Down) {
            d->keypadMove(true);
            return;
        }
    }
#endif
    QTextEdit::keyPressEvent(ev);
}